

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O1

void __thiscall
viennamath::expression_not_evaluable_exception::~expression_not_evaluable_exception
          (expression_not_evaluable_exception *this)

{
  ~expression_not_evaluable_exception(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

virtual ~expression_not_evaluable_exception() throw () {}